

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmulNet.h
# Opt level: O0

EM * __thiscall EM::operator=(EM *this,EM *anotherEM)

{
  int iVar1;
  int local_1c;
  int i;
  EM *anotherEM_local;
  EM *this_local;
  
  iVar1 = getNextId(anotherEM);
  this->nextid = iVar1;
  iVar1 = getCurrBuffSize(anotherEM);
  this->currbuffsize = iVar1;
  iVar1 = getFirstEltIndex(anotherEM);
  this->firsteltindex = iVar1;
  for (local_1c = this->currbuffsize; 0 < local_1c; local_1c = local_1c + -1) {
    this->buff[local_1c] = anotherEM->buff[local_1c];
  }
  return this;
}

Assistant:

EM& operator = (EM &anotherEM) {
		this->nextid = anotherEM.getNextId();
		this->currbuffsize = anotherEM.getCurrBuffSize();
		this->firsteltindex = anotherEM.getFirstEltIndex();
		int i = this->currbuffsize;
		while (i > 0) {
			this->buff[i] = anotherEM.buff[i];
			i--;
		}
		return *this;
	}